

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<(anonymous_namespace)::TreeNode>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::TreeNode> *this,GrowthPosition where,qsizetype n
          ,QArrayDataPointer<(anonymous_namespace)::TreeNode> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  bool bVar4;
  Int IVar5;
  long lVar6;
  TreeNode *__dest;
  long lVar7;
  int in_register_00000034;
  ulong uVar8;
  qsizetype toCopy;
  qsizetype qVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  uVar8 = CONCAT44(in_register_00000034,where);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->d->super_QArrayData;
  if (pQVar1 == (QArrayData *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
  }
  if ((uVar8 == 0 || in_register_00000034 < 0) || (bVar4)) {
    if (pQVar1 == (QArrayData *)0x0) {
      qVar9 = 0;
    }
    else {
      qVar9 = pQVar1->alloc;
    }
    lVar7 = this->size;
    if (qVar9 < lVar7) {
      qVar9 = lVar7;
    }
    if (pQVar1 == (QArrayData *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (lVar7 - pQVar1->alloc) +
              ((long)((long)this->ptr - ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0))
              >> 3) * -0x3333333333333333;
    }
    lVar7 = qVar9 + uVar8 + lVar7;
    if (pQVar1 != (QArrayData *)0x0) {
      lVar6 = pQVar1->alloc;
      if (pQVar1->alloc <= lVar7) {
        lVar6 = lVar7;
      }
      if (((pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar7 = lVar6;
      }
    }
    if (pQVar1 == (QArrayData *)0x0) {
      qVar9 = 0;
    }
    else {
      qVar9 = pQVar1->alloc;
    }
    local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    __dest = (TreeNode *)QArrayData::allocate(&local_38,0x28,0x10,lVar7,(uint)(lVar7 <= qVar9));
    pQVar1 = local_38;
    if (__dest != (TreeNode *)0x0 && local_38 != (QArrayData *)0x0) {
      pDVar2 = this->d;
      IVar5 = 0;
      if (pDVar2 == (Data *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3) * -0x3333333333333333;
        IVar5 = (pDVar2->super_QArrayData).flags.
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
      __dest = __dest + lVar7;
      (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
    }
    if ((this->size == 0) ||
       (qVar9 = this->size + ((long)in_register_00000034 >> 0x1f & uVar8), qVar9 == 0)) {
      qVar9 = 0;
    }
    else {
      memcpy(__dest,this->ptr,qVar9 * 0x28);
    }
    pQVar3 = &this->d->super_QArrayData;
    this->d = (Data *)pQVar1;
    this->ptr = __dest;
    this->size = qVar9;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,0x28,0x10);
      }
    }
  }
  else {
    if (pQVar1 == (QArrayData *)0x0) {
      qVar9 = 0;
      lVar7 = 0;
    }
    else {
      qVar9 = pQVar1->alloc;
      lVar7 = (this->size - pQVar1->alloc) +
              ((long)((long)this->ptr - ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0))
              >> 3) * -0x3333333333333333;
    }
    auVar10 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x28,qVar9 + uVar8 + lVar7,Grow);
    this->d = (Data *)auVar10._0_8_;
    this->ptr = (TreeNode *)auVar10._8_8_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }